

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O3

void opj_mct_encode_real(OPJ_INT32 *c0,OPJ_INT32 *c1,OPJ_INT32 *c2,OPJ_SIZE_T n)

{
  OPJ_SIZE_T OVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (n != 0) {
    OVar1 = 0;
    do {
      lVar3 = (long)c0[OVar1];
      lVar4 = (long)c1[OVar1];
      lVar2 = (long)c2[OVar1];
      c0[OVar1] = (int)(lVar2 * 0x3a6 + 0x1000U >> 0xd) +
                  (int)(lVar4 * 0x12c9 + 0x1000U >> 0xd) + (int)(lVar3 * 0x991 + 0x1000U >> 0xd);
      c1[OVar1] = (int)(lVar2 * 0x1000 + 0x1000U >> 0xd) -
                  ((int)(lVar4 * 0xa9a + 0x1000U >> 0xd) + (int)(lVar3 * 0x566 + 0x1000U >> 0xd));
      c2[OVar1] = (int)(lVar3 * 0x1000 + 0x1000U >> 0xd) -
                  ((int)(lVar2 * 0x29a + 0x1000U >> 0xd) + (int)(lVar4 * 0xd66 + 0x1000U >> 0xd));
      OVar1 = OVar1 + 1;
    } while (n != OVar1);
  }
  return;
}

Assistant:

void opj_mct_encode_real(
    OPJ_INT32* OPJ_RESTRICT c0,
    OPJ_INT32* OPJ_RESTRICT c1,
    OPJ_INT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
    for (i = 0; i < n; ++i) {
        OPJ_INT32 r = c0[i];
        OPJ_INT32 g = c1[i];
        OPJ_INT32 b = c2[i];
        OPJ_INT32 y =  opj_int_fix_mul(r, 2449) + opj_int_fix_mul(g,
                       4809) + opj_int_fix_mul(b, 934);
        OPJ_INT32 u = -opj_int_fix_mul(r, 1382) - opj_int_fix_mul(g,
                      2714) + opj_int_fix_mul(b, 4096);
        OPJ_INT32 v =  opj_int_fix_mul(r, 4096) - opj_int_fix_mul(g,
                       3430) - opj_int_fix_mul(b, 666);
        c0[i] = y;
        c1[i] = u;
        c2[i] = v;
    }
}